

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O1

void inv_taylor<taylor<taylor<double,1,2>,1,2>,2>
               (taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *t,
               taylor<taylor<double,_1,_2>,_1,_2> *a)

{
  double dVar1;
  taylor<taylor<double,_1,_2>,_1,_2> *ptVar2;
  taylor<taylor<double,_1,_2>,_1,_2> *ptVar3;
  long lVar4;
  int i;
  int i_00;
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *ptVar5;
  byte bVar6;
  taylor<taylor<double,_1,_2>,_1,_2> tmp;
  taylor<taylor<double,_1,_2>,_1,_2> local_b8;
  taylor<taylor<double,_1,_2>,_1,_2> local_68;
  
  bVar6 = 0;
  dVar1 = (a->super_polynomial<taylor<double,_1,_2>,_1,_2>).c[0].super_polynomial<double,_1,_2>.c[0]
  ;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    __assert_fail("a != 0 && \"1/(a+x) not analytic at a = 0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/taylor_math.hpp"
                  ,0x24,
                  "void inv_taylor(taylor<T, 1, N> &, const T &) [T = taylor<taylor<double, 1, 2>, 1, 2>, N = 2]"
                 );
  }
  local_68.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[0].super_polynomial<double,_1,_2>.c[0].
  _0_4_ = 1;
  operator/(&local_b8,(int *)&local_68,a);
  ptVar2 = &local_b8;
  ptVar5 = t;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    (ptVar5->super_polynomial<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>).c[0].
    super_polynomial<taylor<double,_1,_2>,_1,_2>.c[0].super_polynomial<double,_1,_2>.c[0] =
         (double)*(undefined8 *)ptVar2;
    ptVar2 = (taylor<taylor<double,_1,_2>,_1,_2> *)((long)ptVar2 + ((ulong)bVar6 * -2 + 1) * 8);
    ptVar5 = (taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)
             ((long)ptVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  i_00 = 0;
  do {
    i = i_00 + 1;
    ptVar2 = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[](t,i_00);
    taylor<taylor<double,_1,_2>,_1,_2>::operator-(&local_68,ptVar2);
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c[0] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c[1] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[1].super_polynomial<double,_1,_2>.c[1] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[1].super_polynomial<double,_1,_2>.c[2] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[0].super_polynomial<double,_1,_2>.c[2] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[1].super_polynomial<double,_1,_2>.c[0] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[0].super_polynomial<double,_1,_2>.c[0] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[0].super_polynomial<double,_1,_2>.c[1] =
         0.0;
    local_b8.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c[2] =
         0.0;
    polymul_internal::taylor_multiplier<taylor<double,_1,_2>,_1,_2,_2>::mul_set
              ((taylor<double,_1,_2> *)&local_b8,(taylor<double,_1,_2> *)&local_68,
               (taylor<double,_1,_2> *)t);
    ptVar3 = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[](t,i);
    ptVar2 = &local_b8;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (ptVar3->super_polynomial<taylor<double,_1,_2>,_1,_2>).c[0].super_polynomial<double,_1,_2>.c
      [0] = *(double *)ptVar2;
      ptVar2 = (taylor<taylor<double,_1,_2>,_1,_2> *)((long)ptVar2 + ((ulong)bVar6 * -2 + 1) * 8);
      ptVar3 = (taylor<taylor<double,_1,_2>,_1,_2> *)((long)ptVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    i_00 = i;
  } while (i != 2);
  return;
}

Assistant:

inline T cbrt(T x) { return pow(x, 1.0 / 3.0); }